

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_misc.c
# Opt level: O0

int luaopen_misc(lua_State *L)

{
  lua_CFunction *in_stack_00000078;
  uint8_t *in_stack_00000080;
  char *in_stack_00000088;
  lua_State *in_stack_00000090;
  
  luaM_sysprof_set_writer((luam_Sysprof_writer)0x144fe1);
  luaM_sysprof_set_on_stop((luam_Sysprof_on_stop)0x144fed);
  luaM_sysprof_set_backtracer((luam_Sysprof_backtracer)0x144ff6);
  lj_lib_register(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  lj_lib_register(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  lj_lib_register(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  return 1;
}

Assistant:

LUALIB_API int luaopen_misc(struct lua_State *L)
{
#if !LJ_TARGET_WINDOWS
  luaM_sysprof_set_writer(buffer_writer_default);
  luaM_sysprof_set_on_stop(on_stop_cb_default);
  /*
  ** XXX: Passing NULL to the backtracer configuration handle sets the default
  ** backtracing function.
  */
  luaM_sysprof_set_backtracer(NULL);
#endif /* !LJ_TARGET_WINDOWS */

  LJ_LIB_REG(L, LUAM_MISCLIBNAME, misc);
#if !LJ_TARGET_WINDOWS
  LJ_LIB_REG(L, LUAM_MISCLIBNAME ".memprof", misc_memprof);
  LJ_LIB_REG(L, LUAM_MISCLIBNAME ".sysprof", misc_sysprof);
#endif /* !LJ_TARGET_WINDOWS */
  return 1;
}